

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O0

void log_add_output_stream
               (log_ctx *ctx,log_level min,log_level max,log_formatter_f *default_f,FILE *out_stream
               )

{
  log_output *plVar1;
  log_output *out;
  FILE *out_stream_local;
  log_formatter_f *default_f_local;
  log_level max_local;
  log_level min_local;
  log_ctx *ctx_local;
  
  ctx->out_len = ctx->out_len + 1;
  plVar1 = (log_output *)realloc(ctx->out,(long)ctx->out_len * 0x18);
  ctx->out = plVar1;
  if (ctx->out == (log_output *)0x0) {
    fprintf(_stderr,"fatal error, can\'t allocate memory for log output\n");
    exit(1);
  }
  plVar1 = ctx->out + (ctx->out_len + -1);
  plVar1->min = min;
  plVar1->max = max;
  plVar1->stream = out_stream;
  plVar1->f = default_f;
  return;
}

Assistant:

void log_add_output_stream(struct log_ctx *ctx, /* IN/OUT */
                           enum log_level min,  /* IN */
                           enum log_level max,  /* IN */
                           log_formatter_f * default_f, /* IN */
                           FILE * out_stream)   /* IN */
{
    struct log_output *out;

    ctx->out_len += 1;
    ctx->out = realloc(ctx->out, ctx->out_len * sizeof(*(ctx->out)));
    if (ctx->out == NULL)
    {
        fprintf(stderr,
                "fatal error, can't allocate memory for log output\n");
        exit(1);
    }
    out = &(ctx->out[ctx->out_len - 1]);
    out->min = min;
    out->max = max;
    out->stream = out_stream;
    out->f = default_f;
}